

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O2

string * FormatISO8601DateTime_abi_cxx11_(string *__return_storage_ptr__,int64_t nTime)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  rep local_80;
  rep local_78;
  uint local_6c;
  uint local_68;
  int local_64;
  hh_mm_ss<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> hms;
  year_month_day ymd;
  enable_if_t<__is_duration<duration<long,_ratio<86400L>_>_>::value,_time_point<system_clock,_duration<long,_ratio<86400L,_1L>_>_>_>
  days;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (nTime / 0x15180) * 0x15180;
  days.__d.__r = (duration)(nTime / 0x15180 - (ulong)(lVar2 - nTime != 0 && nTime <= lVar2));
  std::chrono::year_month_day::year_month_day(&ymd,&days);
  std::chrono::hh_mm_ss<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::hh_mm_ss
            (&hms,(duration<long,_std::ratio<1L,_1L>_>)((long)days.__d.__r * -0x15180 + nTime));
  local_64 = (int)ymd._M_y._M_y;
  local_68 = (uint)ymd._M_m._M_m;
  local_6c = (uint)ymd._M_d._M_d;
  local_78 = hms._M_h.__r;
  local_80 = hms._M_m.__r;
  tinyformat::format<int,unsigned_int,unsigned_int,long,long,long>
            (__return_storage_ptr__,(tinyformat *)"%04i-%02u-%02uT%02i:%02i:%02iZ",(char *)&local_64
             ,(int *)&local_68,&local_6c,(uint *)&local_78,&local_80,
             (long *)&stack0xffffffffffffff78,(long *)hms._M_s.__r);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string FormatISO8601DateTime(int64_t nTime)
{
    const std::chrono::sys_seconds secs{std::chrono::seconds{nTime}};
    const auto days{std::chrono::floor<std::chrono::days>(secs)};
    const std::chrono::year_month_day ymd{days};
    const std::chrono::hh_mm_ss hms{secs - days};
    return strprintf("%04i-%02u-%02uT%02i:%02i:%02iZ", signed{ymd.year()}, unsigned{ymd.month()}, unsigned{ymd.day()}, hms.hours().count(), hms.minutes().count(), hms.seconds().count());
}